

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O0

bool __thiscall LinkedObjectFile::is_empty_list(LinkedObjectFile *this,int seg,int byte_idx)

{
  reference pvVar1;
  int in_EDX;
  vector<LinkedWord,_std::allocator<LinkedWord>_> *in_RDI;
  value_type *word;
  size_type in_stack_ffffffffffffffd8;
  
  if (in_EDX % 4 == 0) {
    std::
    vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
    ::at((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
          *)in_RDI,in_stack_ffffffffffffffd8);
    pvVar1 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                       (in_RDI,in_stack_ffffffffffffffd8);
    return pvVar1->kind == EMPTY_PTR;
  }
  __assert_fail("(byte_idx % 4) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                ,0x2aa,"bool LinkedObjectFile::is_empty_list(int, int)");
}

Assistant:

bool LinkedObjectFile::is_empty_list(int seg, int byte_idx) {
  assert((byte_idx % 4) == 0);
  auto& word = words_by_seg.at(seg).at(byte_idx / 4);
  return word.kind == LinkedWord::EMPTY_PTR;
}